

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O3

bool __thiscall trento::MinDistNucleus::is_too_close(MinDistNucleus *this,const_iterator nucleon)

{
  double dVar1;
  NucleonData *pNVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  dVar1 = this->dminsq_;
  if ((1e-10 <= dVar1) &&
     (pNVar2 = (this->super_Nucleus).nucleons_.
               super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl
               .super__Vector_impl_data._M_start, pNVar2 != nucleon._M_current)) {
    do {
      dVar4 = (nucleon._M_current)->y_ - pNVar2->y_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (nucleon._M_current)->x_ - pNVar2->x_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar4 * dVar4;
      auVar3 = vfmadd231sd_fma(auVar5,auVar3,auVar3);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (nucleon._M_current)->z_ - pNVar2->z_;
      auVar3 = vfmadd231sd_fma(auVar3,auVar6,auVar6);
      dVar4 = auVar3._0_8_;
      if (dVar4 < dVar1) {
        return dVar4 < dVar1;
      }
      pNVar2 = pNVar2 + 1;
    } while (pNVar2 != nucleon._M_current);
    return dVar4 < dVar1;
  }
  return false;
}

Assistant:

bool MinDistNucleus::is_too_close(const_iterator nucleon) const {
  if (dminsq_ < 1e-10)
    return false;
  for (const_iterator nucleon2 = begin(); nucleon2 != nucleon; ++nucleon2) {
    auto dx = nucleon->x() - nucleon2->x();
    auto dy = nucleon->y() - nucleon2->y();
    auto dz = nucleon->z() - nucleon2->z();
    if (dx*dx + dy*dy + dz*dz < dminsq_)
      return true;
  }
  return false;
}